

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodejoin.cc
# Opt level: O2

RC __thiscall QL_NodeJoin::OpenIt(QL_NodeJoin *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = this->useIndexJoin;
  iVar2 = (**this->node1->_vptr_QL_Node)();
  if (bVar1 == false) {
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = (**this->node2->_vptr_QL_Node)();
  }
  if (iVar2 == 0) {
    this->gotFirstTuple = false;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

RC QL_NodeJoin::OpenIt(){
  RC rc = 0;
  if(!useIndexJoin){
    if((rc = node1.OpenIt()) || (rc = node2.OpenIt()))
      return (rc);
  }
  else{
    if((rc = node1.OpenIt() ))
      return (rc);
  }
  gotFirstTuple = false;
 
  return (0);
}